

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

void Vector3OrthoNormalize(Vector3 *v1,Vector3 *v2)

{
  Vector3 VVar1;
  undefined8 local_f8;
  float local_f0;
  Vector3 vn;
  undefined4 uStack_44;
  float local_40;
  Vector3 *v2_local;
  Vector3 *v1_local;
  
  VVar1 = Vector3Normalize(*v1);
  local_40 = VVar1.z;
  stack0xffffffffffffffb8 = VVar1._0_8_;
  v1->z = local_40;
  v1->x = vn.z;
  v1->y = (float)uStack_44;
  VVar1 = Vector3CrossProduct(*v1,*v2);
  VVar1 = Vector3Normalize(VVar1);
  VVar1 = Vector3CrossProduct(VVar1,*v1);
  local_f8 = VVar1._0_8_;
  local_f0 = VVar1.z;
  v2->x = (float)(undefined4)local_f8;
  v2->y = (float)local_f8._4_4_;
  v2->z = local_f0;
  return;
}

Assistant:

RMDEF void Vector3OrthoNormalize(Vector3 *v1, Vector3 *v2)
{
    *v1 = Vector3Normalize(*v1);
    Vector3 vn = Vector3CrossProduct(*v1, *v2);
    vn = Vector3Normalize(vn);
    *v2 = Vector3CrossProduct(vn, *v1);
}